

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O2

bool __thiscall
Assimp::STransformVecInfo::operator==(STransformVecInfo *this,STransformVecInfo *other)

{
  if ((((ABS((this->super_aiUVTransform).mTranslation.x -
             (other->super_aiUVTransform).mTranslation.x) <= 0.05) &&
       (ABS((this->super_aiUVTransform).mTranslation.y - (other->super_aiUVTransform).mTranslation.y
           ) <= 0.05)) &&
      (ABS((this->super_aiUVTransform).mScaling.x - (other->super_aiUVTransform).mScaling.x) <= 0.05
      )) && (ABS((this->super_aiUVTransform).mScaling.y - (other->super_aiUVTransform).mScaling.y)
             <= 0.05)) {
    return ABS((this->super_aiUVTransform).mRotation - (other->super_aiUVTransform).mRotation) <=
           0.05;
  }
  return false;
}

Assistant:

inline bool operator== (const STransformVecInfo& other) const
    {
        // We use a small epsilon here
        const static float epsilon = 0.05f;

        if (std::fabs( mTranslation.x - other.mTranslation.x ) > epsilon ||
            std::fabs( mTranslation.y - other.mTranslation.y ) > epsilon)
        {
            return false;
        }

        if (std::fabs( mScaling.x - other.mScaling.x ) > epsilon ||
            std::fabs( mScaling.y - other.mScaling.y ) > epsilon)
        {
            return false;
        }

        if (std::fabs( mRotation - other.mRotation) > epsilon)
        {
            return false;
        }
        return true;
    }